

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_sync.hpp
# Opt level: O0

void __thiscall unodb::detail::thread_sync::notify(thread_sync *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  thread_sync *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->sync_mutex);
  this->flag = true;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void notify() {
    {
      const std::lock_guard lock{sync_mutex};
      flag = true;
    }
    sync.notify_one();
  }